

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP.cpp
# Opt level: O0

bool __thiscall SRUP_MSG::SignF(SRUP_MSG *this,char *keyfile)

{
  byte bVar1;
  uint16_t uVar2;
  uint uVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  uchar *p_signature;
  SRUP_Crypto Crypto;
  undefined1 local_228 [8];
  ifstream file_check;
  char *keyfile_local;
  SRUP_MSG *this_local;
  
  uVar3 = (*this->_vptr_SRUP_MSG[9])();
  if ((uVar3 & 1) == 0) {
    this_local._7_1_ = false;
  }
  else {
    std::ifstream::ifstream(local_228,keyfile,8);
    bVar1 = std::ios::good();
    if ((bVar1 & 1) == 0) {
      this_local._7_1_ = false;
      Crypto.m_plain_text_length = 1;
      Crypto._34_2_ = 0;
    }
    else {
      this->m_is_serialized = false;
      SRUP_Crypto::SRUP_Crypto((SRUP_Crypto *)&p_signature);
      (*this->_vptr_SRUP_MSG[10])(this,1);
      puVar4 = SRUP_Crypto::SignF((SRUP_Crypto *)&p_signature,this->m_unsigned_message,
                                  (ulong)this->m_unsigned_length,keyfile);
      if (puVar4 == (uint8_t *)0x0) {
        this_local._7_1_ = false;
      }
      else {
        puVar4 = SRUP_Crypto::signature((SRUP_Crypto *)&p_signature);
        uVar2 = SRUP_Crypto::sigLen((SRUP_Crypto *)&p_signature);
        this->m_sig_len = uVar2;
        if (this->m_signature != (uint8_t *)0x0) {
          operator_delete__(this->m_signature);
        }
        puVar5 = (uint8_t *)operator_new__((ulong)this->m_sig_len);
        this->m_signature = puVar5;
        memcpy(this->m_signature,puVar4,(ulong)this->m_sig_len);
        this_local._7_1_ = true;
      }
      Crypto.m_plain_text_length = 1;
      Crypto._34_2_ = 0;
      SRUP_Crypto::~SRUP_Crypto((SRUP_Crypto *)&p_signature);
    }
    std::ifstream::~ifstream(local_228);
  }
  return this_local._7_1_;
}

Assistant:

bool SRUP_MSG::SignF(char *keyfile)
{
    if (!DataCheck())
        return false;

    // Check to see if the keyfile exists before we try to do anything with it...
    std::ifstream file_check(keyfile);
    if (!file_check.good())
        return false;

    m_is_serialized = false;

    SRUP_Crypto Crypto;
    unsigned char* p_signature;

    // Running Serialize with preSign = true - will set m_serialized to the byte stream to be signed...
    Serialize(true);
    if (Crypto.SignF(m_unsigned_message, m_unsigned_length, keyfile) == nullptr)
        return false;

    p_signature = Crypto.signature();
    m_sig_len = (uint16_t) Crypto.sigLen();

    delete[] m_signature;
    
    m_signature = new uint8_t[m_sig_len];

    memcpy(m_signature, p_signature, m_sig_len);

    return true;
}